

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpt.cpp
# Opt level: O1

void __thiscall
pg::QPTSolver::updateState
          (QPTSolver *this,unsigned_long *_n0,unsigned_long *_n1,int *_max0,int *_max1,int *_k0,
          int *_k1)

{
  uint uVar1;
  Game *pGVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  
  pGVar2 = (this->super_Solver).game;
  uVar5 = pGVar2->n_vertices;
  if ((long)uVar5 < 1) {
    uVar4 = 0xffffffff;
    uVar3 = 0;
    uVar6 = 0xffffffff;
    uVar8 = 0;
  }
  else {
    uVar6 = 0xffffffff;
    uVar9 = 0;
    uVar8 = 0;
    uVar4 = 0xffffffff;
    uVar3 = 0;
    do {
      if ((((this->super_Solver).disabled)->_bits[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) == 0) {
        uVar1 = pGVar2->_priority[uVar9];
        if ((uVar1 & 1) == 0) {
          if ((int)uVar4 < (int)uVar1) {
            uVar4 = uVar1;
          }
          uVar8 = uVar8 + 1;
        }
        else {
          if ((int)uVar6 < (int)uVar1) {
            uVar6 = uVar1;
          }
          uVar3 = uVar3 + 1;
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar5 != uVar9);
  }
  *_n0 = uVar8;
  *_n1 = uVar3;
  *_max0 = uVar4;
  *_max1 = uVar6;
  uVar5 = uVar8 + 1;
  uVar4 = (uint)((uVar5 & uVar8) != 0);
  uVar8 = 0x20;
  lVar7 = 0;
  do {
    uVar9 = 0;
    if ((*(ulong *)((long)&ceil_log2(unsigned_long_long)::t + lVar7) & uVar5) != 0) {
      uVar9 = uVar8;
    }
    uVar4 = uVar4 + (int)uVar9;
    uVar5 = uVar5 >> uVar9;
    uVar8 = uVar8 >> 1;
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x30);
  *_k0 = uVar4 + 1;
  uVar5 = uVar3 + 1;
  uVar4 = (uint)((uVar5 & uVar3) != 0);
  uVar3 = 0x20;
  lVar7 = 0;
  do {
    uVar8 = 0;
    if ((*(ulong *)((long)&ceil_log2(unsigned_long_long)::t + lVar7) & uVar5) != 0) {
      uVar8 = uVar3;
    }
    uVar4 = uVar4 + (int)uVar8;
    uVar5 = uVar5 >> uVar8;
    uVar3 = uVar3 >> 1;
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x30);
  *_k1 = uVar4 + 1;
  return;
}

Assistant:

void
QPTSolver::updateState(unsigned long &_n0, unsigned long &_n1, int &_max0, int &_max1, int &_k0, int &_k1)
{
    // determine number of even/odd vertices and highest even/odd priority
    unsigned long n0 = 0;
    unsigned long n1 = 0;
    int max0 = -1;
    int max1 = -1;

    for (int i=0; i<nodecount(); i++) {
        if (disabled[i]) continue;
        const int pr = priority(i);
        if ((pr&1) == 0) {
            if (pr > max0) max0 = pr;
            n0++;
        } else {
            if (pr > max1) max1 = pr;
            n1++;
        }
    }

    _n0 = n0;
    _n1 = n1;
    _max0 = max0;
    _max1 = max1;

    _k0 = 1+ceil_log2(n0+1);
    _k1 = 1+ceil_log2(n1+1);
}